

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,char *s,int32_t sLength)

{
  uint leadByte;
  UStringTrieResult UVar1;
  byte *pos_00;
  UStringTrieResult local_58;
  UStringTrieResult local_54;
  UStringTrieResult result;
  int32_t node_2;
  int32_t node_1;
  int32_t node;
  int32_t inByte;
  int32_t length;
  uint8_t *pos;
  char *pcStack_20;
  int32_t sLength_local;
  char *s_local;
  BytesTrie *this_local;
  
  if (sLength < 0) {
    if (*s == '\0') {
LAB_003f9e05:
      UVar1 = current(this);
      return UVar1;
    }
  }
  else if (sLength == 0) goto LAB_003f9e05;
  _inByte = this->pos_;
  if (_inByte != (byte *)0x0) {
    node = this->remainingMatchLength_;
    pos._4_4_ = sLength;
    pcStack_20 = s;
    while( true ) {
      if (pos._4_4_ < 0) {
        while( true ) {
          node_1 = (int32_t)*pcStack_20;
          if (node_1 == 0) {
            this->remainingMatchLength_ = node;
            this->pos_ = _inByte;
            if ((node < 0) && (0x1f < *_inByte)) {
              local_54 = valueResult((uint)*_inByte);
            }
            else {
              local_54 = USTRINGTRIE_NO_VALUE;
            }
            return local_54;
          }
          if (node < 0) break;
          if (node_1 != (uint)*_inByte) {
            stop(this);
            return USTRINGTRIE_NO_MATCH;
          }
          _inByte = _inByte + 1;
          node = node + -1;
          pcStack_20 = pcStack_20 + 1;
        }
        this->remainingMatchLength_ = node;
        pcStack_20 = pcStack_20 + 1;
      }
      else {
        while( true ) {
          if (pos._4_4_ == 0) {
            this->remainingMatchLength_ = node;
            this->pos_ = _inByte;
            if ((node < 0) && (0x1f < *_inByte)) {
              local_58 = valueResult((uint)*_inByte);
            }
            else {
              local_58 = USTRINGTRIE_NO_VALUE;
            }
            return local_58;
          }
          node_1 = (int32_t)*pcStack_20;
          pos._4_4_ = pos._4_4_ + -1;
          if (node < 0) break;
          if (node_1 != (uint)*_inByte) {
            stop(this);
            return USTRINGTRIE_NO_MATCH;
          }
          _inByte = _inByte + 1;
          node = node + -1;
          pcStack_20 = pcStack_20 + 1;
        }
        this->remainingMatchLength_ = node;
        pcStack_20 = pcStack_20 + 1;
      }
      while( true ) {
        while( true ) {
          pos_00 = _inByte + 1;
          leadByte = (uint)*_inByte;
          if (0xf < leadByte) break;
          UVar1 = branchNext(this,pos_00,leadByte,node_1);
          if (UVar1 == USTRINGTRIE_NO_MATCH) {
            return USTRINGTRIE_NO_MATCH;
          }
          if (pos._4_4_ < 0) {
            node_1 = (int32_t)*pcStack_20;
            if (node_1 == 0) {
              return UVar1;
            }
          }
          else {
            if (pos._4_4_ == 0) {
              return UVar1;
            }
            node_1 = (int32_t)*pcStack_20;
            pos._4_4_ = pos._4_4_ + -1;
          }
          pcStack_20 = pcStack_20 + 1;
          if (UVar1 == USTRINGTRIE_FINAL_VALUE) {
            stop(this);
            return USTRINGTRIE_NO_MATCH;
          }
          _inByte = this->pos_;
        }
        if (leadByte < 0x20) break;
        if ((*_inByte & 1) != 0) {
          stop(this);
          return USTRINGTRIE_NO_MATCH;
        }
        _inByte = skipValue(pos_00,leadByte);
      }
      if (node_1 != (uint)*pos_00) break;
      _inByte = _inByte + 2;
      node = leadByte - 0x11;
    }
    stop(this);
  }
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
BytesTrie::next(const char *s, int32_t sLength) {
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input byte, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t inByte;
        if(sLength<0) {
            for(;;) {
                if((inByte=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                inByte=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        for(;;) {
            int32_t node=*pos++;
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, inByte);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input byte, if there is one.
                if(sLength<0) {
                    if((inByte=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    inByte=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching bytes.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
            } else if(node<kMinValueLead) {
                // Match length+1 bytes.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching bytes.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipValue(pos, node);
                // The next node must not also be a value node.
                U_ASSERT(*pos<kMinValueLead);
            }
        }
    }
}